

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O2

int VectorMismatch_C(uint32_t *array1,uint32_t *array2,int length)

{
  ulong uVar1;
  ulong uVar2;
  
  uVar2 = 0;
  uVar1 = (ulong)(uint)length;
  if (length < 1) {
    uVar1 = uVar2;
  }
  do {
    if (uVar1 == uVar2) {
LAB_001373f4:
      return (int)uVar1;
    }
    if (array1[uVar2] != array2[uVar2]) {
      uVar1 = uVar2 & 0xffffffff;
      goto LAB_001373f4;
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

static int VectorMismatch_C(const uint32_t* const array1,
                            const uint32_t* const array2, int length) {
  int match_len = 0;

  while (match_len < length && array1[match_len] == array2[match_len]) {
    ++match_len;
  }
  return match_len;
}